

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O1

string * __thiscall
phpconvert::StringHelper::join
          (string *__return_storage_ptr__,StringHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,string *delim)

{
  pointer pbVar1;
  pointer pbVar2;
  
  pbVar2 = (in->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (in->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pbVar2 == pbVar1) goto LAB_0012b167;
  std::__cxx11::string::replace
            ((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)(pbVar2->_M_dataplus)._M_p);
  while( true ) {
    pbVar2 = pbVar2 + 1;
LAB_0012b167:
    if (pbVar2 == pbVar1) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)(delim->_M_dataplus)._M_p);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)(pbVar2->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringHelper::join(vector<string>& in, string& delim) {
	return boost::algorithm::join(in, delim);
}